

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void RpcInterruptionPoint(void)

{
  bool bVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  string *in_stack_ffffffffffffffe8;
  char *in_stack_fffffffffffffff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  this = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          (in_FS_OFFSET + 0x28);
  bVar1 = IsRPCRunning();
  if (bVar1) {
    if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28)
        == this) {
      return;
    }
  }
  else {
    uVar2 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,in_stack_fffffffffffffff0,(allocator<char> *)in_stack_ffffffffffffffe8);
    JSONRPCError((int)((ulong)this >> 0x20),in_stack_ffffffffffffffe8);
    if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28)
        == this) {
      __cxa_throw(uVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

void RpcInterruptionPoint()
{
    if (!IsRPCRunning()) throw JSONRPCError(RPC_CLIENT_NOT_CONNECTED, "Shutting down");
}